

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

void __thiscall
pstore::database::sizes::update_footer_pos
          (sizes *this,typed_address<pstore::trailer> new_footer_pos)

{
  value_type vVar1;
  unsigned_long *puVar2;
  unsigned_long local_20;
  sizes *local_18;
  sizes *this_local;
  typed_address<pstore::trailer> new_footer_pos_local;
  
  local_18 = this;
  this_local = (sizes *)new_footer_pos.a_.a_;
  vVar1 = typed_address<pstore::trailer>::absolute((typed_address<pstore::trailer> *)&this_local);
  if (0x3f < vVar1) {
    (this->footer_pos_).a_.a_ = (value_type)this_local;
    vVar1 = typed_address<pstore::trailer>::absolute(&this->footer_pos_);
    local_20 = vVar1 + 0x70;
    puVar2 = std::max<unsigned_long>(&this->logical_,&local_20);
    this->logical_ = *puVar2;
    return;
  }
  assert_failed("new_footer_pos.absolute () >= leader_size",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/database.hpp"
                ,0x1a1);
}

Assistant:

void update_footer_pos (typed_address<trailer> const new_footer_pos) noexcept {
                PSTORE_ASSERT (new_footer_pos.absolute () >= leader_size);
                footer_pos_ = new_footer_pos;
                logical_ = std::max (logical_, footer_pos_.absolute () + sizeof (trailer));
            }